

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec.cpp
# Opt level: O0

void exitUsage(char *command)

{
  ostream *poVar1;
  char *command_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\nConverts an integer into decimal form.\n\nUsage: ");
  poVar1 = std::operator<<(poVar1,command);
  poVar1 = std::operator<<(poVar1,
                           " [-s] integer\n\nOptions:\n   -s = interpret hex values as signed values\n\n   signed integer =   [-0x80000000..0x7fffffff] \n                      [-2147483648..2147483647] \n   unsigned integer = [0x00000000..0xffffffff] \n                      [0..4294967295] \n"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void exitUsage(const char* command) {
   cout << "\n"
   "Converts an integer into decimal form.\n"
   "\n"
   "Usage: " << command << " [-s] integer\n"
   "\n"
   "Options:\n"
   "   -s = interpret hex values as signed values\n"
   "\n"
   "   signed integer =   [-0x80000000..0x7fffffff] \n"
   "                      [-2147483648..2147483647] \n"
   "   unsigned integer = [0x00000000..0xffffffff] \n"
   "                      [0..4294967295] \n"
   << endl;
   exit(1);
}